

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigTable.c
# Opt level: O1

void Fraig_TablePrintStatsF(Fraig_Man_t *pMan)

{
  Fraig_HashTable_t *pFVar1;
  Fraig_Node_t *pFVar2;
  uint uVar3;
  long lVar4;
  
  pFVar1 = pMan->pTableF;
  printf("Functional table. Table size = %d. Number of entries = %d.\n",(ulong)(uint)pFVar1->nBins,
         (ulong)(uint)pFVar1->nEntries);
  if (0 < pFVar1->nBins) {
    lVar4 = 0;
    do {
      pFVar2 = pFVar1->pBins[lVar4];
      uVar3 = 0;
      if (pFVar2 != (Fraig_Node_t *)0x0) {
        uVar3 = 0;
        do {
          uVar3 = uVar3 + 1;
          pFVar2 = pFVar2->pNextF;
        } while (pFVar2 != (Fraig_Node_t *)0x0);
      }
      if (1 < uVar3) {
        printf("{%d} ");
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < pFVar1->nBins);
  }
  putchar(10);
  return;
}

Assistant:

void Fraig_TablePrintStatsF( Fraig_Man_t * pMan )
{
    Fraig_HashTable_t * pT = pMan->pTableF;
    Fraig_Node_t * pNode;
    int i, Counter;

    printf( "Functional table. Table size = %d. Number of entries = %d.\n", pT->nBins, pT->nEntries );
    for ( i = 0; i < pT->nBins; i++ )
    {
        Counter = 0;
        Fraig_TableBinForEachEntryF( pT->pBins[i], pNode )
            Counter++;
        if ( Counter > 1 )
            printf( "{%d} ", Counter );
    }
    printf( "\n" );
}